

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

uint8_t * apx_attributeParser_parse_scalar(apx_attributeParser_t *self,uint8_t *begin,uint8_t *end)

{
  byte bVar1;
  ushort **ppuVar2;
  dtl_sv_t *pdVar3;
  uint8_t *puVar4;
  uint8_t *result_2;
  uint8_t *result_1;
  uint8_t *result;
  uint8_t *puStack_30;
  uint8_t c;
  uint8_t *next;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_attributeParser_t *self_local;
  
  bVar1 = *begin;
  if (self == (apx_attributeParser_t *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                  ,0x2d3,
                  "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                 );
  }
  puStack_30 = begin;
  if (bVar1 != 0) {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)(uint)bVar1] & 0x800) == 0) {
      if (bVar1 == 0x2d) {
        puStack_30 = begin + 1;
        if (end <= puStack_30) {
          return (uint8_t *)0x0;
        }
        pdVar3 = dtl_sv_new();
        self->state->sv = pdVar3;
        puVar4 = apx_attributeParser_parse_integer_literal(puStack_30,end,true,self->state->sv);
        if ((puStack_30 < puVar4) && (puStack_30 = puVar4, end < puVar4)) {
          __assert_fail("result <= end",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                        ,0x2eb,
                        "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                       );
        }
      }
      else {
        puStack_30 = begin;
        if (bVar1 == 0x22) {
          pdVar3 = dtl_sv_new();
          self->state->sv = pdVar3;
          puVar4 = apx_attributeParser_parse_string_literal(begin,end,self->state->sv);
          puStack_30 = begin;
          if ((begin < puVar4) && (puStack_30 = puVar4, end < puVar4)) {
            __assert_fail("result <= end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                          ,0x2fb,
                          "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                         );
          }
        }
      }
    }
    else {
      pdVar3 = dtl_sv_new();
      self->state->sv = pdVar3;
      puVar4 = apx_attributeParser_parse_integer_literal(begin,end,false,self->state->sv);
      puStack_30 = begin;
      if ((begin < puVar4) && (puStack_30 = puVar4, end < puVar4)) {
        __assert_fail("result <= end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                      ,0x2dd,
                      "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                     );
      }
    }
  }
  return puStack_30;
}

Assistant:

static uint8_t const* apx_attributeParser_parse_scalar(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   uint8_t c = *next;
   assert(self != NULL);
   if (c > 0)
   {
      if (isdigit(c))
      {
         uint8_t const* result;
         self->state->sv = dtl_sv_new();
         result = apx_attributeParser_parse_integer_literal(next, end, false, self->state->sv);
         if (result > next)
         {
            assert(result <= end);
            next = result;
         }
      }
      else if (c == '-')
      {
         next++;
         if (next < end)
         {
            uint8_t const* result;
            self->state->sv = dtl_sv_new();
            result = apx_attributeParser_parse_integer_literal(next, end, true, self->state->sv);
            if (result > next)
            {
               assert(result <= end);
               next = result;
            }
         }
         else
         {
            return NULL; //Nothing after the minus sign?
         }
      }
      else if (c == '"')
      {
         uint8_t const* result;
         self->state->sv = dtl_sv_new();
         result = apx_attributeParser_parse_string_literal(next, end, self->state->sv);
         if (result > next)
         {
            assert(result <= end);
            next = result;
         }
      }
   }
   return next;
}